

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_expression.hpp
# Opt level: O0

value_type __thiscall
jsoncons::jsonpath::
jsonpath_expression<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
::evaluate(jsonpath_expression<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
           *this,const_reference root,result_options options)

{
  result_options rVar1;
  result_options in_ECX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_RSI;
  allocator_type *in_RDI;
  value_type vVar3;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  context;
  anon_class_8_1_6971b95b callback;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  context_1;
  value_type *result;
  reference in_stack_00000268;
  path_node_type *in_stack_00000270;
  reference in_stack_00000278;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_00000280;
  path_expression<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_00000288;
  anon_class_8_1_6971b95b in_stack_00000290;
  result_options in_stack_000002a0;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_fffffffffffffde0;
  allocator_type *alloc;
  reference in_stack_fffffffffffffe38;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_fffffffffffffe40;
  path_expression<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_fffffffffffffe48;
  result_options in_stack_fffffffffffffe60;
  
  alloc = in_RDI;
  rVar1 = operator&(in_ECX,path);
  if (rVar1 == path) {
    detail::
    eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
    ::eval_context(in_RSI,alloc);
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)in_RDI,0,
               in_RSI);
    basic_path_node<wchar_t>::basic_path_node((basic_path_node<wchar_t> *)in_stack_fffffffffffffde0)
    ;
    detail::
    path_expression<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
    ::
    evaluate<jsoncons::jsonpath::jsonpath_expression<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>::evaluate(jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::jsonpath::result_options)const::_lambda(jsoncons::jsonpath::basic_path_node<wchar_t>const&,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&)_1_>
              (in_stack_00000288,in_stack_00000280,in_stack_00000278,in_stack_00000270,
               in_stack_00000268,in_stack_00000290,in_stack_000002a0);
    detail::
    eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
    ::~eval_context(in_stack_fffffffffffffde0);
    uVar2 = extraout_RDX;
  }
  else {
    detail::
    eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
    ::eval_context(in_RSI,alloc);
    basic_path_node<wchar_t>::basic_path_node((basic_path_node<wchar_t> *)in_stack_fffffffffffffde0)
    ;
    detail::
    path_expression<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
    ::evaluate(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
               (path_node_type *)in_RSI,(reference)alloc,in_stack_fffffffffffffe60);
    detail::
    eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
    ::~eval_context(in_stack_fffffffffffffde0);
    uVar2 = extraout_RDX_00;
  }
  vVar3.field_0.int64_.val_ = uVar2;
  vVar3.field_0._0_8_ = alloc;
  return (value_type)vVar3.field_0;
}

Assistant:

value_type evaluate(const_reference root, result_options options = result_options()) const
        {
            if ((options & result_options::path) == result_options::path)
            {
                jsoncons::jsonpath::detail::eval_context<value_type, const_reference> context{ alloc_ };

                value_type result(json_array_arg, semantic_tag::none, alloc_);
                auto callback = [&result](const path_node_type& p, const_reference)
                {
                    result.emplace_back(to_basic_string(p));
                };
                const_expr_.evaluate(context, root, path_node_type{}, root, callback, options);
                return result;
            }
            jsoncons::jsonpath::detail::eval_context<value_type, const_reference> context{ alloc_ };
            return const_expr_.evaluate(context, root, path_node_type{}, root, options);
        }